

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

uint32_t __thiscall
spirv_cross::CompilerMSL::ensure_correct_input_type
          (CompilerMSL *this,uint32_t type_id,uint32_t location,uint32_t num_components)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  uint uVar3;
  uint32_t uVar4;
  SPIRType *pSVar5;
  runtime_error *prVar6;
  BaseType basetype;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  bool bVar9;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pSVar5 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + type_id);
  p_Var8 = (this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var8 == (_Base_ptr)0x0) {
LAB_00257eac:
    if (num_components <= pSVar5->vecsize) {
      return type_id;
    }
  }
  else {
    p_Var1 = &(this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header;
    p_Var7 = &p_Var1->_M_header;
    do {
      bVar9 = p_Var8[1]._M_color < location;
      if (!bVar9) {
        p_Var7 = p_Var8;
      }
      p_Var8 = (&p_Var8->_M_left)[bVar9];
    } while (p_Var8 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var7 == p_Var1) || (location < p_Var7[1]._M_color)) goto LAB_00257eac;
    if (num_components == 0) {
      num_components = *(uint32_t *)&p_Var7[1]._M_left;
    }
    if (*(int *)&p_Var7[1]._M_parent == 2) {
      iVar2 = *(int *)&(pSVar5->super_IVariant).field_0xc;
      if (iVar2 != 8) {
        if (iVar2 == 7) goto switchD_00257efa_caseD_7;
        if (iVar2 != 6) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_40[0] = local_30;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_40,"Vertex attribute type mismatch between host and shader","")
          ;
          ::std::runtime_error::runtime_error(prVar6,(string *)local_40);
          *(undefined ***)prVar6 = &PTR__runtime_error_00357118;
          __cxa_throw(prVar6,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
    }
    else if (*(int *)&p_Var7[1]._M_parent == 1) {
      switch(*(undefined4 *)&(pSVar5->super_IVariant).field_0xc) {
      case 4:
      case 6:
      case 8:
        break;
      case 5:
        uVar3 = pSVar5->vecsize;
        if (pSVar5->vecsize < num_components) {
          uVar3 = num_components;
        }
        num_components = uVar3;
        basetype = UShort;
        goto LAB_00257eba;
      case 7:
switchD_00257efa_caseD_7:
        uVar3 = pSVar5->vecsize;
        if (pSVar5->vecsize < num_components) {
          uVar3 = num_components;
        }
        num_components = uVar3;
        basetype = UInt;
        goto LAB_00257eba;
      default:
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_40[0] = local_30;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_40,"Vertex attribute type mismatch between host and shader","");
        ::std::runtime_error::runtime_error(prVar6,(string *)local_40);
        *(undefined ***)prVar6 = &PTR__runtime_error_00357118;
        __cxa_throw(prVar6,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    if (num_components <= pSVar5->vecsize) {
      return type_id;
    }
  }
  basetype = Unknown;
LAB_00257eba:
  uVar4 = build_extended_vector_type(this,type_id,num_components,basetype);
  return uVar4;
}

Assistant:

uint32_t CompilerMSL::ensure_correct_input_type(uint32_t type_id, uint32_t location, uint32_t num_components)
{
	auto &type = get<SPIRType>(type_id);

	auto p_va = inputs_by_location.find(location);
	if (p_va == end(inputs_by_location))
	{
		if (num_components > type.vecsize)
			return build_extended_vector_type(type_id, num_components);
		else
			return type_id;
	}

	if (num_components == 0)
		num_components = p_va->second.vecsize;

	switch (p_va->second.format)
	{
	case MSL_SHADER_INPUT_FORMAT_UINT8:
	{
		switch (type.basetype)
		{
		case SPIRType::UByte:
		case SPIRType::UShort:
		case SPIRType::UInt:
			if (num_components > type.vecsize)
				return build_extended_vector_type(type_id, num_components);
			else
				return type_id;

		case SPIRType::Short:
			return build_extended_vector_type(type_id, num_components > type.vecsize ? num_components : type.vecsize,
			                                  SPIRType::UShort);
		case SPIRType::Int:
			return build_extended_vector_type(type_id, num_components > type.vecsize ? num_components : type.vecsize,
			                                  SPIRType::UInt);

		default:
			SPIRV_CROSS_THROW("Vertex attribute type mismatch between host and shader");
		}
	}

	case MSL_SHADER_INPUT_FORMAT_UINT16:
	{
		switch (type.basetype)
		{
		case SPIRType::UShort:
		case SPIRType::UInt:
			if (num_components > type.vecsize)
				return build_extended_vector_type(type_id, num_components);
			else
				return type_id;

		case SPIRType::Int:
			return build_extended_vector_type(type_id, num_components > type.vecsize ? num_components : type.vecsize,
			                                  SPIRType::UInt);

		default:
			SPIRV_CROSS_THROW("Vertex attribute type mismatch between host and shader");
		}
	}

	default:
		if (num_components > type.vecsize)
			type_id = build_extended_vector_type(type_id, num_components);
		break;
	}

	return type_id;
}